

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_uc_to_curlcode(CURLUcode uc)

{
  if (uc - CURLUE_UNSUPPORTED_SCHEME < 4) {
    return *(CURLcode *)(&DAT_00446620 + (ulong)(uc - CURLUE_UNSUPPORTED_SCHEME) * 4);
  }
  return CURLE_URL_MALFORMAT;
}

Assistant:

CURLcode Curl_uc_to_curlcode(CURLUcode uc)
{
  switch(uc) {
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    return CURLE_UNSUPPORTED_PROTOCOL;
  case CURLUE_OUT_OF_MEMORY:
    return CURLE_OUT_OF_MEMORY;
  case CURLUE_USER_NOT_ALLOWED:
    return CURLE_LOGIN_DENIED;
  }
}